

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseUDP.cpp
# Opt level: O3

Result __thiscall
tonk::UDPSocket::Initialize
          (UDPSocket *this,Dependencies *deps,IPVersion bindIPVersion,uint16_t port,
          TonkSocketConfig *socketConfig,TonkSocket apiTonkSocket,
          shared_ptr<asio::io_context::strand> *asioConnectStrand)

{
  implementation_type *impl;
  int *piVar1;
  ConnectionIdMap *pCVar2;
  undefined2 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  RefCounter *owner;
  basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_> *pbVar6;
  uchar auVar7 [8];
  pthread_mutex_t *__mutex;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  INATPortPool *pIVar9;
  P2PConnectionKeyMap *pPVar10;
  undefined1 auVar11 [8];
  uint64_t oldstate;
  uint64_t uVar12;
  pointer __p;
  datagram_socket_service<asio::ip::udp> *pdVar13;
  _func_int **pp_Var14;
  long *plVar15;
  ErrorResult *pEVar16;
  OutputWorker *this_00;
  uint8_t *readBuffer;
  undefined8 *puVar17;
  undefined6 in_register_0000000a;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  type_info *ptVar19;
  undefined4 in_register_00000014;
  int iVar20;
  _func_int *p_Var21;
  long lVar22;
  Dependencies *pDVar23;
  type_info *ptVar24;
  BufferAllocator *pBVar25;
  bool bVar26;
  error_code eVar27;
  undefined8 *in_stack_00000010;
  UDPAddress local_ep;
  error_code ec_1;
  address bindAddr;
  error_code local_270;
  Dependencies *local_260;
  undefined1 local_258 [16];
  undefined8 local_248;
  long lStack_240;
  error_code local_238;
  undefined1 local_228 [8];
  size_type local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_218;
  int local_204;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  ErrorResult local_1f0;
  undefined1 local_1b8 [8];
  undefined1 auStack_1b0 [8];
  undefined8 uStack_1a8;
  uint local_1a0;
  ios_base local_138 [264];
  
  puVar17 = (undefined8 *)CONCAT44(in_register_00000014,bindIPVersion);
  local_260 = (Dependencies *)CONCAT44(local_260._4_4_,(int)socketConfig);
  local_204 = (int)CONCAT62(in_register_0000000a,port);
  deps[2].ReadBufferAllocator = (BufferAllocator *)puVar17[2];
  pCVar2 = (ConnectionIdMap *)puVar17[1];
  deps[1].MappedPortPtr = (shared_ptr<tonk::gateway::MappedPortLifetime> *)*puVar17;
  deps[1].IdMap = pCVar2;
  deps[2].SocketRefCount = (RefCounter *)puVar17[3];
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&deps[2].Logger,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar17 + 4));
  p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar17[6];
  pIVar9 = (INATPortPool *)puVar17[7];
  pPVar10 = (P2PConnectionKeyMap *)puVar17[8];
  deps[2].Context.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)puVar17[5];
  deps[2].Context.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var8;
  deps[2].NATPool = pIVar9;
  deps[2].P2PKeyMap = pPVar10;
  deps[2].MappedPortPtr = (shared_ptr<tonk::gateway::MappedPortLifetime> *)apiTonkSocket;
  deps[2].IdMap = (ConnectionIdMap *)asioConnectStrand;
  deps[3].NATPool = (INATPortPool *)*in_stack_00000010;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&deps[3].P2PKeyMap,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(in_stack_00000010 + 1));
  LOCK();
  *(undefined1 *)&deps[3].SocketRefCount = 0;
  UNLOCK();
  uVar12 = siamese::GetTimeUsec();
  pCVar2 = (ConnectionIdMap *)(uVar12 * 2 + 1);
  deps[3].IdMap = pCVar2;
  deps[3].MappedPortPtr =
       (shared_ptr<tonk::gateway::MappedPortLifetime> *)((long)pCVar2 * 0x5851f42d4c957f2e);
  (this->super_IUDPSender)._vptr_IUDPSender = (_func_int **)0x0;
  FloodDetector::Initialize
            ((FloodDetector *)local_1b8,(int)deps + 0x120,*(uint *)(apiTonkSocket + 0x24));
  auVar11 = local_1b8;
  local_1b8 = (undefined1  [8])0x0;
  (this->super_IUDPSender)._vptr_IUDPSender = (_func_int **)auVar11;
  Result::~Result((Result *)local_1b8);
  if ((this->super_IUDPSender)._vptr_IUDPSender != (_func_int **)0x0) goto LAB_00133324;
  owner = deps[2].SocketRefCount;
  __p = (pointer)operator_new(0x20,(nothrow_t *)&std::nothrow);
  if (__p != (pointer)0x0) {
    local_258._0_8_ =
         &asio::detail::typeid_wrapper<asio::datagram_socket_service<asio::ip::udp>>::typeinfo;
    local_258[8] = '\0';
    local_258[9] = '\0';
    local_258[10] = '\0';
    local_258[0xb] = '\0';
    local_258[0xc] = '\0';
    local_258[0xd] = '\0';
    local_258[0xe] = '\0';
    local_258[0xf] = '\0';
    pdVar13 = (datagram_socket_service<asio::ip::udp> *)
              asio::detail::service_registry::do_use_service
                        (*(service_registry **)owner,(key *)local_258,
                         asio::detail::service_registry::
                         create<asio::datagram_socket_service<asio::ip::udp>,asio::io_context>,owner
                        );
    (__p->super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>).
    super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>.service_ = pdVar13;
    (__p->super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>).
    super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>.implementation_.
    protocol_.family_ = 2;
    (__p->super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>).
    super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>.implementation_.
    super_base_implementation_type.socket_ = -1;
    (__p->super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>).
    super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>.implementation_.
    super_base_implementation_type.state_ = '\0';
  }
  pDVar23 = deps + 3;
  std::
  __uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
  ::reset((__uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
           *)pDVar23,__p);
  pBVar25 = deps[3].ReadBufferAllocator;
  if (pBVar25 == (BufferAllocator *)0x0) {
    local_258._0_8_ = local_258 + 0x10;
    local_258[8] = '\0';
    local_258[9] = '\0';
    local_258[10] = '\0';
    local_258[0xb] = '\0';
    local_258[0xc] = '\0';
    local_258[0xd] = '\0';
    local_258[0xe] = '\0';
    local_258[0xf] = '\0';
    local_248 = local_248 & 0xffffffffffffff00;
    pp_Var14 = (_func_int **)operator_new(0x38);
    (this->super_IUDPSender)._vptr_IUDPSender = pp_Var14;
    *pp_Var14 = (_func_int *)"Out of memory";
    pp_Var14[1] = (_func_int *)(pp_Var14 + 3);
    pp_Var14[2] = (_func_int *)0x0;
    *(undefined1 *)(pp_Var14 + 3) = 0;
    *(undefined4 *)(pp_Var14 + 5) = 0;
    pp_Var14[6] = (_func_int *)0x10;
LAB_00132ef1:
    local_1b8 = (undefined1  [8])0x0;
    Result::~Result((Result *)local_1b8);
    goto LAB_00133319;
  }
  local_270._M_value = 0;
  local_270._M_cat = (error_category *)std::_V2::system_category();
  aStack_218._8_4_ = 0;
  local_220 = 0;
  aStack_218._M_allocated_capacity = 0;
  local_228 = (undefined1  [8])0x2;
  local_1f0.Description._M_string_length = (size_type)local_270._M_cat;
  if (*(char **)(apiTonkSocket + 0x40) == (char *)0x0) {
    bVar26 = local_204 == 1;
    uStack_1a8._0_4_ = 0;
    local_1b8 = (undefined1  [8])0x0;
    auStack_1b0 = (undefined1  [8])0x0;
    local_228._2_2_ = swap_bytes((short)local_260);
    local_228._0_2_ = (ushort)!bVar26 * 8 + 2;
    local_228._4_4_ = 0;
    aStack_218._8_4_ = 0;
    local_220 = 0;
    aStack_218._M_allocated_capacity = 0;
LAB_00132fc8:
    iVar20 = (uint)(bVar26 ^ 1) * 8 + 2;
    eVar27 = asio::detail::reactive_socket_service_base::do_open
                       (&(((datagram_socket_service<asio::ip::udp> *)
                          (pBVar25->AllocatorLock).cs.super___recursive_mutex_base._M_mutex.__align)
                         ->service_impl_).super_reactive_socket_service_base,
                        (base_implementation_type *)
                        ((long)&(pBVar25->AllocatorLock).cs.super___recursive_mutex_base._M_mutex +
                        8),iVar20,2,0x11,&local_270);
    if (eVar27._M_value == 0) {
      *(int *)&(pBVar25->AllocatorLock).cs.super___recursive_mutex_base._M_mutex.__data.__list.
               __prev = iVar20;
    }
    if (local_270._M_value != 0) {
      (**(code **)(*(long *)local_270._M_cat + 0x20))(local_1b8);
      iVar20 = local_270._M_value;
      pp_Var14 = (_func_int **)operator_new(0x38);
      *pp_Var14 = (_func_int *)"UDP socket open failed";
      pp_Var14[1] = (_func_int *)(pp_Var14 + 3);
      std::__cxx11::string::_M_construct<char*>
                ((string *)(pp_Var14 + 1),local_1b8,(long)(char **)local_1b8 + (long)auStack_1b0);
LAB_00133064:
      paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_258;
      *(undefined4 *)(pp_Var14 + 5) = 2;
      pp_Var14[6] = (_func_int *)(long)iVar20;
      (this->super_IUDPSender)._vptr_IUDPSender = pp_Var14;
LAB_0013307b:
      paVar18->_M_allocated_capacity = 0;
      Result::~Result((Result *)&paVar18->_M_allocated_capacity);
      puVar17 = &uStack_1a8;
      goto LAB_0013308f;
    }
    pbVar6 = (((tuple<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                *)&pDVar23->ReadBufferAllocator)->
             super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
             ).
             super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
             ._M_head_impl;
    uVar4 = *(undefined4 *)(apiTonkSocket + 0x14);
    uVar5 = *(undefined4 *)(apiTonkSocket + 0x18);
    local_238._M_value = 0;
    local_258._0_4_ = 1;
    local_238._M_cat = (error_category *)local_1f0.Description._M_string_length;
    impl = &(pbVar6->
            super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>).
            super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>.
            implementation_;
    local_260 = pDVar23;
    asio::detail::reactive_socket_service<asio::ip::udp>::
    set_option<asio::detail::socket_option::boolean<1,6>>
              (&((pbVar6->
                 super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>).
                 super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>.service_)
                ->service_impl_,impl,(boolean<1,_6> *)local_258,&local_238);
    if (local_238._M_value == 0) {
      local_258._0_4_ = uVar4;
      asio::detail::reactive_socket_service<asio::ip::udp>::
      set_option<asio::detail::socket_option::integer<1,7>>
                (&((pbVar6->
                   super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>)
                   .super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>.
                  service_)->service_impl_,impl,(integer<1,_7> *)local_258,&local_238);
      if (local_238._M_value != 0) goto LAB_00133190;
      local_258._0_4_ = uVar5;
      asio::detail::reactive_socket_service<asio::ip::udp>::
      set_option<asio::detail::socket_option::integer<1,8>>
                (&((pbVar6->
                   super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>)
                   .super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>.
                  service_)->service_impl_,impl,(integer<1,_8> *)local_258,&local_238);
      if (local_238._M_value != 0) goto LAB_00133190;
      local_258._0_4_ = 1;
      asio::detail::reactive_socket_service<asio::ip::udp>::
      set_option<asio::detail::socket_option::boolean<1,2>>
                (&((pbVar6->
                   super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>)
                   .super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>.
                  service_)->service_impl_,impl,(boolean<1,_2> *)local_258,&local_238);
      if (local_238._M_value != 0) goto LAB_00133190;
      local_1b8 = (undefined1  [8])0x0;
      pDVar23 = local_260;
    }
    else {
LAB_00133190:
      (**(code **)(*(long *)local_238._M_cat + 0x20))(&local_1f0.Description.field_2);
      plVar15 = (long *)std::__cxx11::string::append(local_1f0.Description.field_2._M_local_buf);
      local_200._M_allocated_capacity = (size_type)&local_1f0;
      pEVar16 = (ErrorResult *)(plVar15 + 2);
      if ((ErrorResult *)*plVar15 == pEVar16) {
        local_1f0.Source = pEVar16->Source;
        local_1f0.Description._M_dataplus._M_p = (pointer)plVar15[3];
      }
      else {
        local_1f0.Source = pEVar16->Source;
        local_200._M_allocated_capacity = (size_type)(ErrorResult *)*plVar15;
      }
      local_200._8_8_ = plVar15[1];
      *plVar15 = (long)pEVar16;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      plVar15 = (long *)std::__cxx11::string::append(local_200._M_local_buf);
      ptVar19 = (type_info *)(plVar15 + 2);
      if ((type_info *)*plVar15 == ptVar19) {
        local_248 = *(undefined8 *)&ptVar19->field_0x0;
        lStack_240 = plVar15[3];
        ptVar24 = (type_info *)(local_258 + 0x10);
      }
      else {
        local_248 = *(undefined8 *)&ptVar19->field_0x0;
        ptVar24 = (type_info *)*plVar15;
      }
      auVar7 = *(uchar (*) [8])(plVar15 + 1);
      *plVar15 = (long)ptVar19;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      lVar22 = (long)local_238._M_value;
      local_258._0_8_ = ptVar24;
      local_258._8_8_ = auVar7;
      pEVar16 = (ErrorResult *)operator_new(0x38);
      pEVar16->Source = "set_option";
      (pEVar16->Description)._M_dataplus._M_p = (pointer)&(pEVar16->Description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pEVar16->Description,ptVar24,
                 (id *)((long)&ptVar24->field_0x0 + (long)auVar7));
      pDVar23 = local_260;
      pEVar16->Type = Asio;
      pEVar16->Code = lVar22;
      local_1b8 = (undefined1  [8])pEVar16;
      if ((type_info *)local_258._0_8_ != (type_info *)(local_258 + 0x10)) {
        operator_delete((void *)local_258._0_8_);
      }
      if ((ErrorResult *)local_200._M_allocated_capacity != &local_1f0) {
        operator_delete((void *)local_200._M_allocated_capacity);
      }
      if ((ErrorType *)
          CONCAT44(local_1f0.Description.field_2._M_allocated_capacity._4_4_,
                   local_1f0.Description.field_2._M_allocated_capacity._0_4_) != &local_1f0.Type) {
        operator_delete((undefined1 *)
                        CONCAT44(local_1f0.Description.field_2._M_allocated_capacity._4_4_,
                                 local_1f0.Description.field_2._M_allocated_capacity._0_4_));
      }
    }
    (this->super_IUDPSender)._vptr_IUDPSender = (_func_int **)local_1b8;
    local_1b8 = (undefined1  [8])0x0;
    Result::~Result((Result *)local_1b8);
    if ((this->super_IUDPSender)._vptr_IUDPSender == (_func_int **)0x0) {
      pbVar6 = (((tuple<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                  *)&pDVar23->ReadBufferAllocator)->
               super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
               ).
               super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
               ._M_head_impl;
      asio::detail::reactive_socket_service<asio::ip::udp>::bind
                (&((pbVar6->
                   super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>)
                   .super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>.
                  service_)->service_impl_,(int)pbVar6 + 8,(sockaddr *)local_228,
                 (socklen_t)&local_270);
      if (local_270._M_value != 0) {
        (**(code **)(*(long *)local_270._M_cat + 0x20))(local_1b8);
        iVar20 = local_270._M_value;
        pp_Var14 = (_func_int **)operator_new(0x38);
        *pp_Var14 = (_func_int *)"UDP socket bind failed";
        pp_Var14[1] = (_func_int *)(pp_Var14 + 3);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(pp_Var14 + 1),local_1b8,(long)(char **)local_1b8 + (long)auStack_1b0);
        goto LAB_00133064;
      }
      pbVar6 = (((tuple<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                  *)&pDVar23->ReadBufferAllocator)->
               super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
               ).
               super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
               ._M_head_impl;
      asio::detail::reactive_socket_service<asio::ip::udp>::local_endpoint
                ((endpoint_type *)local_258,
                 &((pbVar6->
                   super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>)
                   .super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>.
                  service_)->service_impl_,
                 &(pbVar6->
                  super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>).
                  super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>.
                  implementation_,&local_270);
      if (local_270._M_value == 0) {
        uVar3 = swap_bytes(local_258._2_2_);
        *(undefined2 *)&deps[5].P2PKeyMap = uVar3;
        __mutex = (pthread_mutex_t *)deps[1].MappedPortPtr;
        iVar20 = pthread_mutex_lock(__mutex);
        if (iVar20 != 0) {
          std::__throw_system_error(iVar20);
        }
        readBuffer = pktalloc::Allocator::Allocate((Allocator *)&__mutex[1].__data,0x546);
        if (__mutex != (pthread_mutex_t *)0x0) {
          pthread_mutex_unlock(__mutex);
        }
        if (readBuffer == (uint8_t *)0x0) {
          Result::OutOfMemory();
          (this->super_IUDPSender)._vptr_IUDPSender = (_func_int **)local_1b8;
          goto LAB_00132ef1;
        }
        LOCK();
        piVar1 = (int *)((long)&((deps[1].IdMap)->IdLock).cs.super___recursive_mutex_base._M_mutex +
                        0x20);
        *piVar1 = *piVar1 + 1;
        UNLOCK();
        postNextRead((UDPSocket *)deps,readBuffer);
        goto LAB_00133319;
      }
      (**(code **)(*(long *)local_270._M_cat + 0x20))(local_1b8);
      p_Var21 = (_func_int *)(long)local_270._M_value;
      pp_Var14 = (_func_int **)operator_new(0x38);
      *pp_Var14 = (_func_int *)"local_endpoint failed";
      pp_Var14[1] = (_func_int *)(pp_Var14 + 3);
      std::__cxx11::string::_M_construct<char*>
                ((string *)(pp_Var14 + 1),local_1b8,(long)(char **)local_1b8 + (long)auStack_1b0);
      *(undefined4 *)(pp_Var14 + 5) = 2;
      pp_Var14[6] = p_Var21;
      (this->super_IUDPSender)._vptr_IUDPSender = pp_Var14;
      paVar18 = &local_200;
      goto LAB_0013307b;
    }
  }
  else {
    asio::ip::make_address((address *)local_1b8,*(char **)(apiTonkSocket + 0x40),&local_270);
    if (local_270._M_value == 0) {
      local_200._M_allocated_capacity = local_200._M_allocated_capacity & 0xffffffff00000000;
      local_1f0.Description.field_2._M_allocated_capacity._0_4_ = 0;
      if (local_1b8._0_4_ == ipv6) {
        aStack_218._M_allocated_capacity = CONCAT44(uStack_1a8._4_4_,(undefined4)uStack_1a8);
        paVar18 = &local_1f0.Description.field_2;
        local_228._0_2_ = 10;
        bVar26 = false;
        local_220 = (size_type)auStack_1b0;
      }
      else {
        if (local_1b8._0_4_ != ipv4) {
          local_258._0_8_ = &PTR__bad_cast_001b6fa0;
          puVar17 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar17 = &PTR__bad_cast_001b6fa0;
          __cxa_throw(puVar17,&asio::ip::bad_address_cast::typeinfo,std::bad_cast::~bad_cast);
        }
        aStack_218._M_allocated_capacity = 0;
        paVar18 = &local_200;
        local_228._0_2_ = 2;
        bVar26 = true;
        local_1a0 = local_1b8._4_4_;
        local_220 = 0;
      }
      *(uint *)paVar18 = local_1a0;
      local_228._2_2_ = (ushort)local_260 << 8 | (ushort)local_260 >> 8;
      local_228._4_4_ = local_200._M_allocated_capacity._0_4_;
      aStack_218._8_4_ = local_1f0.Description.field_2._M_allocated_capacity._0_4_;
      pBVar25 = (BufferAllocator *)
                (((tuple<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                   *)&pDVar23->ReadBufferAllocator)->
                super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                ).
                super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
                ._M_head_impl;
      goto LAB_00132fc8;
    }
    (**(code **)(*(long *)local_270._M_cat + 0x20))(local_258);
    p_Var21 = (_func_int *)(long)local_270._M_value;
    pp_Var14 = (_func_int **)operator_new(0x38);
    *pp_Var14 = (_func_int *)"Provided InterfaceAddress was invalid";
    pp_Var14[1] = (_func_int *)(pp_Var14 + 3);
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pp_Var14 + 1),local_258._0_8_,
               (type_info *)(local_258._8_8_ + local_258._0_8_));
    *(undefined4 *)(pp_Var14 + 5) = 2;
    pp_Var14[6] = p_Var21;
    (this->super_IUDPSender)._vptr_IUDPSender = pp_Var14;
    local_200._M_allocated_capacity = 0;
    Result::~Result((Result *)&local_200._M_allocated_capacity);
    puVar17 = (undefined8 *)(local_258 + 0x10);
LAB_0013308f:
    if ((undefined8 *)puVar17[-2] != puVar17) {
      operator_delete((undefined8 *)puVar17[-2]);
    }
  }
LAB_00133319:
  if ((this->super_IUDPSender)._vptr_IUDPSender == (_func_int **)0x0) {
    return (Result)this;
  }
LAB_00133324:
  pBVar25 = deps[2].ReadBufferAllocator;
  Result::ToJson_abi_cxx11_((string *)local_228,(Result *)this);
  if ((pBVar25->AllocatorLock).cs.super___recursive_mutex_base._M_mutex.__data.__owner < 5) {
    local_1b8 = (undefined1  [8])
                (pBVar25->AllocatorLock).cs.super___recursive_mutex_base._M_mutex.__align;
    auStack_1b0._0_4_ = 4;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&uStack_1a8,
               (char *)(pBVar25->Allocator).PreferredWindows.PreallocatedData[1],
               (long)(pBVar25->Allocator).PreferredWindows.PreallocatedData[2]);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&uStack_1a8,"UDPSocket::Initialize failed: ",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&uStack_1a8,(char *)local_228,local_220);
    this_00 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(this_00,(LogStringBuffer *)local_1b8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1a8);
    std::ios_base::~ios_base(local_138);
  }
  if (local_228 != (undefined1  [8])(local_228 + 0x10)) {
    operator_delete((void *)local_228);
  }
  CloseSocket((UDPSocket *)deps);
  return (Result)(ErrorResult *)this;
}

Assistant:

Result UDPSocket::Initialize(
    const Dependencies& deps,
    IPVersion bindIPVersion,
    uint16_t port,
    const TonkSocketConfig* socketConfig,
    TonkSocket apiTonkSocket,
    std::shared_ptr<asio::io_context::strand> asioConnectStrand)
{
    Deps = deps;
    SocketConfig = socketConfig;
    APITonkSocket = apiTonkSocket;
    AsioConnectStrand = asioConnectStrand;
    TONK_DEBUG_ASSERT(asioConnectStrand != nullptr);
    SocketClosed = false;

#ifdef TONK_ENABLE_ARTIFICIAL_PACKETLOSS
#ifdef TONK_DEFAULT_ARTIFICIAL_PACKETLOSS
    SetArtificialPacketloss(TONK_DEFAULT_ARTIFICIAL_PACKETLOSS);
#endif
    ArtificialPacketlossPRNG.Seed(siamese::GetTimeUsec());
#endif

    Result result;

    try
    {
        result = FloodDetect.Initialize(
            socketConfig->MaximumClientsPerIP,
            socketConfig->MinuteFloodThresh
        );
        if (result.IsFail()) {
            goto OnError;
        }

        // Create a UDP socket for the connection attempt
        Socket = MakeUniqueNoThrow<asio::ip::udp::socket>(*Deps.Context);
        if (!Socket)
        {
            result = Result::OutOfMemory();
            goto OnError;
        }

        asio::error_code ec;

        // If application specified an interface address:
        UDPAddress bindAddress;
        if (socketConfig->InterfaceAddress)
        {
            // Convert provided interface address to Asio address
            asio::ip::address bindAddr = asio::ip::make_address(socketConfig->InterfaceAddress, ec);
            if (ec)
            {
                result = Result("Provided InterfaceAddress was invalid", ec.message(), ErrorType::Asio, ec.value());
                goto OnError;
            }

            // Bind to the provided interface address
            bindAddress = UDPAddress(bindAddr, port);
        }
        else
        {
            // Create an IPv4/IPv6 socket based on the server address type
            asio::ip::udp internet_protocol = (bindIPVersion == IPVersion::V4)
                ? asio::ip::udp::v4() : asio::ip::udp::v6();

            // Note: Asio default endpoint address is the any address e.g. INADDR_ANY
            bindAddress = UDPAddress(internet_protocol, port);
        }

        // Open socket
        Socket->open(bindAddress.protocol(), ec);
        if (ec)
        {
            result = Result("UDP socket open failed", ec.message(), ErrorType::Asio, ec.value());
            goto OnError;
        }

        // Set common socket options before bind
        result = SetUDPSocketOptions(
            *Socket,
            socketConfig->UDPSendBufferSizeBytes,
            socketConfig->UDPRecvBufferSizeBytes);
        if (result.IsFail()) {
            goto OnError;
        }

        // Bind socket
        Socket->bind(bindAddress, ec);
        if (ec)
        {
            result = Result("UDP socket bind failed", ec.message(), ErrorType::Asio, ec.value());
            goto OnError;
        }

        // Get local bound port
        const UDPAddress local_ep = Socket->local_endpoint(ec);
        if (ec)
        {
            result = Result("local_endpoint failed", ec.message(), ErrorType::Asio, ec.value());
            goto OnError;
        }
        LocalBoundPort = local_ep.port();

#ifdef TONK_DONT_FRAGMENT
        result = dontFragment(true);
        if (result.IsFail()) {
            goto OnError;
        }
#endif // TONK_DONT_FRAGMENT

#ifdef TONK_IGNORE_ICMP_UNREACHABLE
        result = ignoreUnreachable(true);
        if (result.IsFail()) {
            goto OnError;
        }
#endif // TONK_IGNORE_ICMP_UNREACHABLE

        // Allocate the first read buffer
        uint8_t* readBuffer = Deps.ReadBufferAllocator->Allocate(kReadBufferBytes);
        if (!readBuffer)
        {
            result = Result::OutOfMemory();
            goto OnError;
        }

        // Post the first read
        Deps.SocketRefCount->IncrementReferences();
        postNextRead(readBuffer);
    }
    catch (...)
    {
        TONK_DEBUG_BREAK(); // Should never happen except out of memory error
        result = Result("UDPSocket::CreateSocket", "Exception!", ErrorType::Asio);
    }

OnError:
    if (result.IsFail())
    {
        Deps.Logger->Error("UDPSocket::Initialize failed: ", result.ToJson());
        CloseSocket();
    }
    return result;
}